

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cpp
# Opt level: O2

ostream * operator<<(ostream *ostream,RGB rgb)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(ostream,"R=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," G=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," B=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return ostream;
}

Assistant:

std::ostream& operator<<(std::ostream& ostream, RGB rgb) {

    ostream << "R=" << static_cast<std::uint32_t>(rgb.r) << " G=" << static_cast<std::uint32_t>(rgb.g) << " B=" << static_cast<std::uint32_t>(rgb.b);
    return ostream;
  }